

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O0

ImageT<unsigned_char,_2U> * __thiscall
ImageT<unsigned_char,_2U>::swizzle(ImageT<unsigned_char,_2U> *this,string_view swizzle)

{
  Color *pCVar1;
  uchar val;
  uint32_t uVar2;
  uint uVar3;
  size_type sVar4;
  ImageT<unsigned_char,_2U> *in_RDI;
  uint32_t c;
  Color srcPixel;
  size_t i;
  uint uVar5;
  ImageT<unsigned_char,_2U> *this_00;
  uint local_28;
  ImageT<unsigned_char,_2U> *local_20;
  basic_string_view<char,_std::char_traits<char>_> local_10;
  
  sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_10);
  if (sVar4 == 4) {
    local_20 = (ImageT<unsigned_char,_2U> *)0x0;
    while( true ) {
      this_00 = local_20;
      uVar2 = Image::getPixelCount(&in_RDI->super_Image);
      if ((ImageT<unsigned_char,_2U> *)(ulong)uVar2 <= this_00) break;
      local_28 = 0;
      while( true ) {
        uVar5 = local_28;
        uVar3 = (*(in_RDI->super_Image)._vptr_Image[5])();
        if (uVar3 <= uVar5) break;
        pCVar1 = in_RDI->pixels;
        uVar3 = local_28;
        std::basic_string_view<char,_std::char_traits<char>_>::operator[](&local_10,(ulong)local_28)
        ;
        val = swizzlePixel(this_00,(Color *)CONCAT44(uVar5,uVar3),
                           (char)((ulong)(pCVar1 + (long)local_20) >> 0x38));
        color<unsigned_char,_2U>::set(pCVar1 + (long)local_20,uVar3,val);
        local_28 = local_28 + 1;
      }
      local_20 = (ImageT<unsigned_char,_2U> *)((long)&(local_20->super_Image)._vptr_Image + 1);
    }
    return in_RDI;
  }
  __assert_fail("swizzle.size() == 4",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                ,0x4fe,
                "virtual ImageT<componentType, componentCount> &ImageT<unsigned char, 2>::swizzle(std::string_view) [componentType = unsigned char, componentCount = 2]"
               );
}

Assistant:

virtual ImageT& swizzle(std::string_view swizzle) override {
        assert(swizzle.size() == 4);
        for (size_t i = 0; i < getPixelCount(); i++) {
            Color srcPixel = pixels[i];
            for (uint32_t c = 0; c < getComponentCount(); c++) {
                pixels[i].set(c, swizzlePixel(srcPixel, swizzle[c]));
            }
        }
        return *this;
    }